

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall QGles2RenderBuffer::destroy(QGles2RenderBuffer *this)

{
  long lVar1;
  QList<QRhiGles2::DeferredReleaseEntry> *in_RDI;
  long in_FS_OFFSET;
  QRhiGles2 *rhiD;
  DeferredReleaseEntry e;
  QRhiResource *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&in_RDI[3].d.d != 0) {
    *(undefined4 *)&in_RDI[3].d.d = 0;
    *(undefined4 *)((long)&in_RDI[3].d.d + 4) = 0;
    if ((in_RDI->d).ptr != (DeferredReleaseEntry *)0x0) {
      if (((ulong)in_RDI[3].d.ptr & 0x100000000) != 0) {
        QList<QRhiGles2::DeferredReleaseEntry>::append
                  (in_RDI,(parameter_type)in_stack_ffffffffffffffc8);
      }
      QRhiImplementation::unregisterResource
                ((QRhiImplementation *)0x92c840,in_stack_ffffffffffffffc8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGles2RenderBuffer::destroy()
{
    if (!renderbuffer)
        return;

    QRhiGles2::DeferredReleaseEntry e;
    e.type = QRhiGles2::DeferredReleaseEntry::RenderBuffer;

    e.renderbuffer.renderbuffer = renderbuffer;
    e.renderbuffer.renderbuffer2 = stencilRenderbuffer;

    renderbuffer = 0;
    stencilRenderbuffer = 0;

    QRHI_RES_RHI(QRhiGles2);
    if (rhiD) {
        if (owns)
            rhiD->releaseQueue.append(e);
        rhiD->unregisterResource(this);
    }
}